

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O3

uint32_t *
FastPForLib::packingvector<32U>::unpackmetight<unsigned_int>
          (uint32_t *in,uint *out,size_t outSize,uint32_t bit)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t *in_00;
  uint uVar7;
  uint32_t buffer [64];
  uint32_t local_138 [66];
  
  uVar1 = *in;
  in_00 = in + 1;
  uVar2 = (ulong)bit;
  uVar5 = 0;
  if (0x1f < uVar1) {
    uVar5 = 0;
    do {
      iVar4 = (int)uVar5;
      puVar6 = out + uVar5;
      uVar5 = (ulong)(iVar4 + 0x20);
      fastunpack(in_00,puVar6,bit);
      in_00 = in_00 + uVar2;
    } while (iVar4 + 0x3fU < uVar1);
  }
  uVar7 = (uint)uVar5;
  puVar6 = local_138;
  memcpy(puVar6,in_00,(ulong)((uVar1 - uVar7) * bit + 0x1f >> 3 & 0xfffffffc));
  uVar3 = outSize - uVar5;
  if (uVar3 != 0) {
    do {
      fastunpack(puVar6,out + uVar5,bit);
      uVar7 = (int)uVar5 + 0x20;
      uVar5 = (ulong)uVar7;
      puVar6 = puVar6 + uVar2;
    } while (uVar5 != outSize);
  }
  return (uint32_t *)
         ((long)in_00 + ((uVar3 >> 5) * uVar2 * 4 - (ulong)(((uVar7 - uVar1) * bit >> 5) << 2)));
}

Assistant:

static const uint32_t *unpackmetight(
                                       const uint32_t *in,
                                       IntType * out,
                                       size_t outSize,
                                       const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    uint32_t j = 0;
    for (; j + PACKSIZE - 1 < size; j += PACKSIZE) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE * 2];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (outSize - j) / PACKSIZE * bit;
    for (; j != outSize; j += PACKSIZE) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    return in;
  }